

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool CheckPubKeyEncoding(valtype *vchPubKey,uint flags,SigVersion *sigversion,ScriptError *serror)

{
  long lVar1;
  bool bVar2;
  valtype *in_RCX;
  int *in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI & 2) != 0) {
    bVar2 = IsCompressedOrUncompressedPubKey(in_RCX);
    if (!bVar2) {
      local_9 = anon_unknown.dwarf_4a160d::set_error
                          ((ScriptError *)
                           CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                           SCRIPT_ERR_OK);
      goto LAB_003ebfb8;
    }
  }
  if (((in_ESI & 0x8000) != 0) && (*in_RDX == 1)) {
    bVar2 = IsCompressedPubKey(in_RCX);
    if (!bVar2) {
      local_9 = anon_unknown.dwarf_4a160d::set_error
                          ((ScriptError *)
                           CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                           SCRIPT_ERR_OK);
      goto LAB_003ebfb8;
    }
  }
  local_9 = true;
LAB_003ebfb8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool static CheckPubKeyEncoding(const valtype &vchPubKey, unsigned int flags, const SigVersion &sigversion, ScriptError* serror) {
    if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsCompressedOrUncompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_PUBKEYTYPE);
    }
    // Only compressed keys are accepted in segwit
    if ((flags & SCRIPT_VERIFY_WITNESS_PUBKEYTYPE) != 0 && sigversion == SigVersion::WITNESS_V0 && !IsCompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_WITNESS_PUBKEYTYPE);
    }
    return true;
}